

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FileDescriptorSet::ByteSizeLong(FileDescriptorSet *this)

{
  bool bVar1;
  int iVar2;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *this_00;
  reference value;
  size_t sVar3;
  FileDescriptorProto *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  FileDescriptorSet *this_;
  FileDescriptorSet *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar2 = _internal_file_size(this);
  sStack_58 = (long)iVar2 + sStack_58;
  this_00 = _internal_file(this);
  __end3 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::begin(this_00);
  msg = (FileDescriptorProto *)RepeatedPtrField<google::protobuf::FileDescriptorProto>::end(this_00)
  ;
  while( true ) {
    bVar1 = internal::operator!=(&__end3,(iterator *)&msg);
    if (!bVar1) break;
    value = internal::RepeatedPtrIterator<const_google::protobuf::FileDescriptorProto>::operator*
                      (&__end3);
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::FileDescriptorProto>(value);
    sStack_58 = sVar3 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::FileDescriptorProto>::operator++(&__end3);
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t FileDescriptorSet::ByteSizeLong() const {
  const FileDescriptorSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileDescriptorSet)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.FileDescriptorProto file = 1;
    {
      total_size += 1UL * this_._internal_file_size();
      for (const auto& msg : this_._internal_file()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}